

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
internal_emplace<int_const&>
          (btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *this
          ,iterator iter,int *args)

{
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  bVar1;
  byte bVar2;
  iterator iVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_28;
  
  local_28.node = iter.node;
  local_28.position = iter.position;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (local_28.node[0xb] ==
        (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
         )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::decrement(&local_28);
      local_28.position = local_28.position + 1;
    }
    if (((ulong)local_28.node & 7) == 0) {
      bVar1 = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
               )0x3d;
      if (local_28.node[0xb] !=
          (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
           )0x0) {
        bVar1 = local_28.node[0xb];
      }
      if (local_28.node[10] == bVar1) {
        if ((byte)bVar1 < 0x3d) {
          if (local_28.node !=
              *(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                **)this) {
            __assert_fail("iter.node == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xc27,
                          "iterator phmap::priv::btree<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>, Args = <const int &>]"
                         );
          }
          bVar2 = 0x3d;
          if ((byte)((char)bVar1 * '\x02') < 0x3d) {
            bVar2 = (char)bVar1 * '\x02';
          }
          local_28.node =
               btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
               ::new_leaf_root_node
                         ((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                           *)this,(uint)bVar2);
          btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          ::swap(local_28.node,
                 *(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                   **)this,(allocator_type *)this);
          btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          delete_leaf_node((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                            *)this,*(node_type **)this);
          *(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            **)this = local_28.node;
          *(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            **)(this + 8) = local_28.node;
        }
        else {
          btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
          rebalance_or_split((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                              *)this,&local_28);
        }
      }
      btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
      emplace_value<int_const&>
                ((btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>
                  *)local_28.node,(long)local_28.position,(allocator_type *)this,args);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      iVar3.position = local_28.position;
      iVar3.node = local_28.node;
      iVar3._12_4_ = 0;
      return iVar3;
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }